

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O1

ssize_t __thiscall
vk::DescriptorSetUpdateBuilder::write
          (DescriptorSetUpdateBuilder *this,int __fd,void *__buf,size_t __n)

{
  pointer *ppVVar1;
  iterator __position;
  undefined4 in_register_00000034;
  uint in_R8D;
  undefined4 in_R9D;
  ulong uVar2;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  undefined1 local_a8 [24];
  pointer pVStack_90;
  pointer local_88;
  pointer pVStack_80;
  pointer local_78;
  pointer pHStack_70;
  pointer local_68;
  VkWriteDescriptorSet local_60;
  
  local_60.dstSet.m_internal = CONCAT44(in_register_00000034,__fd);
  local_60.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  local_60.pNext = (void *)0x0;
  local_60.dstBinding = (deUint32)__buf;
  local_60.dstArrayElement = (deUint32)__n;
  local_60.pImageInfo = (VkDescriptorImageInfo *)0x0;
  local_60.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  local_60.pTexelBufferView = (VkBufferView *)0x0;
  __position._M_current =
       (this->m_writes).
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_writes).
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vk::VkWriteDescriptorSet,std::allocator<vk::VkWriteDescriptorSet>>::
    _M_realloc_insert<vk::VkWriteDescriptorSet_const&>
              ((vector<vk::VkWriteDescriptorSet,std::allocator<vk::VkWriteDescriptorSet>> *)
               &this->m_writes,__position,&local_60);
  }
  else {
    (__position._M_current)->pBufferInfo = (VkDescriptorBufferInfo *)0x0;
    (__position._M_current)->pTexelBufferView = (VkBufferView *)0x0;
    (__position._M_current)->descriptorCount = in_R8D;
    (__position._M_current)->descriptorType = in_R9D;
    (__position._M_current)->pImageInfo = (VkDescriptorImageInfo *)0x0;
    ((__position._M_current)->dstSet).m_internal = local_60.dstSet.m_internal;
    (__position._M_current)->dstBinding = local_60.dstBinding;
    (__position._M_current)->dstArrayElement = local_60.dstArrayElement;
    *(ulong *)__position._M_current = CONCAT44(local_60._4_4_,0x23);
    (__position._M_current)->pNext = (void *)0x0;
    ppVVar1 = &(this->m_writes).
               super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  local_78 = (pointer)0x0;
  pHStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pVStack_80 = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  pVStack_90 = (pointer)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_68 = (pointer)0x0;
  uVar2 = (ulong)in_R8D;
  if (in_stack_00000008 != 0) {
    std::vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>>::
    _M_range_insert<vk::VkDescriptorImageInfo_const*>
              ((vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>> *)
               local_a8,0,in_stack_00000008,in_stack_00000008 + uVar2 * 0x18);
  }
  if (in_stack_00000010 != 0) {
    std::vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>>::
    _M_range_insert<vk::VkDescriptorBufferInfo_const*>
              ((vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>> *)
               &pVStack_90,local_88,in_stack_00000010,in_stack_00000010 + uVar2 * 0x18);
  }
  if (in_stack_00000018 != 0) {
    std::vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>::
    _M_range_insert<vk::Handle<(vk::HandleType)12>const*>
              ((vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>
                *)&local_78,pHStack_70,in_stack_00000018,in_stack_00000018 + uVar2 * 8);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::push_back(&this->m_writeDescriptorInfos,(value_type *)local_a8);
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (pVStack_90 != (pointer)0x0) {
    operator_delete(pVStack_90,(long)pVStack_80 - (long)pVStack_90);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
  }
  return (ssize_t)this;
}

Assistant:

DescriptorSetUpdateBuilder& DescriptorSetUpdateBuilder::write (VkDescriptorSet					destSet,
															   deUint32							destBinding,
															   deUint32							destArrayElement,
															   deUint32							count,
															   VkDescriptorType					descriptorType,
															   const VkDescriptorImageInfo*		pImageInfo,
															   const VkDescriptorBufferInfo*	pBufferInfo,
															   const VkBufferView*				pTexelBufferView)
{
	// pImageInfo, pBufferInfo and pTexelBufferView will be updated when calling update()
	const VkWriteDescriptorSet writeParams =
	{
		VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
		DE_NULL,
		destSet,			//!< destSet
		destBinding,		//!< destBinding
		destArrayElement,	//!< destArrayElement
		count,				//!< count
		descriptorType,		//!< descriptorType
		DE_NULL,
		DE_NULL,
		DE_NULL
	};

	m_writes.push_back(writeParams);

	// Store a copy of pImageInfo, pBufferInfo and pTexelBufferView
	WriteDescriptorInfo	writeInfo;

	if (pImageInfo)
		writeInfo.imageInfos.insert(writeInfo.imageInfos.end(), pImageInfo, pImageInfo + count);

	if (pBufferInfo)
		writeInfo.bufferInfos.insert(writeInfo.bufferInfos.end(), pBufferInfo, pBufferInfo + count);

	if (pTexelBufferView)
		writeInfo.texelBufferViews.insert(writeInfo.texelBufferViews.end(), pTexelBufferView, pTexelBufferView + count);

	m_writeDescriptorInfos.push_back(writeInfo);

	return *this;
}